

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall presolve::HPresolve::changeColLower(HPresolve *this,HighsInt col,double newLower)

{
  HighsLp *pHVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double local_38;
  
  pHVar1 = this->model;
  if ((pHVar1->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start[col] == kContinuous) {
    pdVar3 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = pdVar3[col];
  }
  else {
    newLower = ceil(newLower - this->primal_feastol);
    pdVar3 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = pdVar3[col];
    if ((newLower == local_38) && (!NAN(newLower) && !NAN(local_38))) {
      return;
    }
  }
  pdVar3[col] = newLower;
  lVar5 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[col];
  pdVar6 = (double *)
           ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5);
  if (lVar5 == -1) {
    pdVar6 = (double *)0x0;
  }
  piVar2 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + lVar5;
  if (lVar5 == -1) {
    pdVar7 = (double *)0x0;
  }
  while ((int)lVar5 != -1) {
    HighsLinearSumBounds::updatedVarLower
              (&this->impliedRowBounds,*(HighsInt *)pdVar6,col,*pdVar7,local_38);
    markChangedRow(this,*(HighsInt *)pdVar6);
    lVar4 = (long)(int)lVar5;
    lVar5 = (long)piVar2[lVar4];
    pdVar6 = (double *)((long)pdVar6 + lVar5 * 4 + lVar4 * -4);
    pdVar7 = pdVar7 + (lVar5 - lVar4);
  }
  return;
}

Assistant:

void HPresolve::changeColLower(HighsInt col, double newLower) {
  if (model->integrality_[col] != HighsVarType::kContinuous) {
    newLower = std::ceil(newLower - primal_feastol);
    if (newLower == model->col_lower_[col]) return;
  }

  double oldLower = model->col_lower_[col];
  model->col_lower_[col] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedVarLower(nonzero.index(), col, nonzero.value(),
                                     oldLower);
    markChangedRow(nonzero.index());
  }
}